

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.h
# Opt level: O1

bool __thiscall
tonk::SDKConnectionList<MyP2PClientConnection>::Insert
          (SDKConnectionList<MyP2PClientConnection> *this,SDKConnection *connection)

{
  pointer psVar1;
  SDKConnection *pSVar2;
  int iVar3;
  pointer psVar4;
  bool bVar5;
  shared_ptr<tonk::SDKConnection> sStack_28;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  psVar4 = (this->ConnectionList).
           super__Vector_base<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->ConnectionList).
           super__Vector_base<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = psVar4 == psVar1;
  if (bVar5) {
LAB_001060f4:
    std::__shared_ptr<tonk::SDKConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<tonk::SDKConnection,void>
              ((__shared_ptr<tonk::SDKConnection,(__gnu_cxx::_Lock_policy)2> *)&sStack_28,
               (__weak_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2> *)
               &connection->super_enable_shared_from_this<tonk::SDKConnection>);
    std::
    vector<std::shared_ptr<tonk::SDKConnection>,std::allocator<std::shared_ptr<tonk::SDKConnection>>>
    ::emplace_back<std::shared_ptr<tonk::SDKConnection>>
              ((vector<std::shared_ptr<tonk::SDKConnection>,std::allocator<std::shared_ptr<tonk::SDKConnection>>>
                *)&this->ConnectionList,&sStack_28);
    if (sStack_28.super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (sStack_28.super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    pSVar2 = (psVar4->super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    while (pSVar2 != connection) {
      psVar4 = psVar4 + 1;
      bVar5 = psVar4 == psVar1;
      if (bVar5) goto LAB_001060f4;
      pSVar2 = (psVar4->super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return bVar5;
}

Assistant:

bool Insert(SDKConnection* connection)
    {
        std::lock_guard<std::mutex> locker(ConnectionListLock);
        for (auto& ii : ConnectionList)
            if (ii.get() == connection)
                return false;
        ConnectionList.push_back(connection->shared_from_this());
        return true;
    }